

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# unqlite.c
# Opt level: O2

sxi32 ExtractToken(char **pzIn,char *zEnd,char *zMask,int nMasklen,SyString *pOut)

{
  int iVar1;
  char *pcVar2;
  char *pcVar3;
  char *pcVar4;
  char *pcVar5;
  
  pcVar2 = *pzIn;
  pcVar5 = pcVar2;
  while( true ) {
    if (zEnd <= pcVar2) {
      return -0x12;
    }
    pcVar3 = pcVar2;
    if ((0xffffffbf < (uint)(int)*pcVar2) ||
       (iVar1 = CheckMask((int)*pcVar2,zMask,nMasklen,(int *)0x0), iVar1 == 0)) break;
    pcVar2 = pcVar2 + 1;
    pcVar5 = (char *)(ulong)((int)pcVar5 + 1);
  }
  while (pcVar3 < zEnd) {
    if ((uint)(int)*pcVar3 < 0xffffffc0) {
      iVar1 = CheckMask((int)*pcVar3,zMask,nMasklen,(int *)0x0);
      if (iVar1 != 0) break;
      pcVar3 = pcVar3 + 1;
    }
    else {
      pcVar4 = pcVar3 + 1;
      pcVar3 = zEnd;
      if (pcVar4 < zEnd) {
        pcVar3 = pcVar4;
      }
    }
  }
  pOut->zString = pcVar2;
  pOut->nByte = (int)pcVar3 - (int)pcVar5;
  *pzIn = pcVar3;
  return 0;
}

Assistant:

static sxi32 ExtractToken(const char **pzIn, const char *zEnd, const char *zMask, int nMasklen, SyString *pOut)
{
	const char *zIn = *pzIn;
	const char *zPtr;
	/* Ignore leading delimiter */
	while( zIn < zEnd && (unsigned char)zIn[0] < 0xc0 && CheckMask(zIn[0], zMask, nMasklen, 0) ){
		zIn++;
	}
	if( zIn >= zEnd ){
		/* End of input */
		return SXERR_EOF;
	}
	zPtr = zIn;
	/* Extract the token */
	while( zIn < zEnd ){
		if( (unsigned char)zIn[0] >= 0xc0 ){
			/* UTF-8 stream */
			zIn++;
			SX_JMP_UTF8(zIn, zEnd);
		}else{
			if( CheckMask(zIn[0], zMask, nMasklen, 0) ){
				break;
			}
			zIn++;
		}
	}
	SyStringInitFromBuf(pOut, zPtr, zIn-zPtr);
	/* Update the cursor */
	*pzIn = zIn;
	/* Return to the caller */
	return SXRET_OK;
}